

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int *x_00;
  undefined8 in_RDI;
  stbi__jpeg *j;
  int result;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  x_00 = (int *)stbi__malloc(0x61a2f2);
  *(undefined8 *)x_00 = in_RDI;
  iVar1 = stbi__jpeg_info_raw((stbi__jpeg *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),x_00,
                              in_stack_ffffffffffffffc8,(int *)0x61a31d);
  free(x_00);
  return iVar1;
}

Assistant:

static int stbi__jpeg_info(stbi__context *s, int *x, int *y, int *comp)
{
   int result;
   stbi__jpeg* j = (stbi__jpeg*) (stbi__malloc(sizeof(stbi__jpeg)));
   j->s = s;
   result = stbi__jpeg_info_raw(j, x, y, comp);
   STBI_FREE(j);
   return result;
}